

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

string * __thiscall
libtorrent::file_rename_failed_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,file_rename_failed_alert *this)

{
  error_category *peVar1;
  char msg [200];
  string local_128;
  string local_108;
  char local_e8 [208];
  
  torrent_alert::message_abi_cxx11_(__return_storage_ptr__,&this->super_torrent_alert);
  snprintf(local_e8,200,": failed to rename file %d: ",(ulong)(uint)(this->index).m_val);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  peVar1 = (this->error).cat_;
  (*peVar1->_vptr_error_category[4])(&local_108,peVar1,(ulong)(uint)(this->error).val_);
  convert_from_native(&local_128,&local_108);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_128._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string file_rename_failed_alert::message() const
	{
		std::string ret { torrent_alert::message() };
		char msg[200];
		std::snprintf(msg, sizeof(msg), ": failed to rename file %d: "
			, static_cast<int>(index));
		ret.append(msg);
		ret.append(convert_from_native(error.message()));
		return ret;
	}